

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

parameter * __thiscall
clipp::command<char_const(&)[13]>(parameter *__return_storage_ptr__,clipp *this,char (*flag) [13])

{
  size_t sVar1;
  arg_string local_140;
  parameter local_120;
  
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  sVar1 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,this,this + sVar1);
  parameter::parameter<>(&local_120,&local_140);
  local_120.required_ = true;
  local_120.super_token<clipp::parameter>.repeatable_ = false;
  local_120.super_token<clipp::parameter>.blocking_ = true;
  parameter::parameter(__return_storage_ptr__,&local_120);
  parameter::~parameter(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline parameter
command(String&& flag, Strings&&... flags)
{
    return parameter{std::forward<String>(flag), std::forward<Strings>(flags)...}
        .required(true).blocking(true).repeatable(false);
}